

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O0

int Abc_ExorcismMain(Vec_Wec_t *vEsop,int nIns,int nOuts,char *pFileNameOut,int Quality,
                    int Verbosity)

{
  uint uVar1;
  int iVar2;
  int Verbosity_local;
  int Quality_local;
  char *pFileNameOut_local;
  int nOuts_local;
  int nIns_local;
  Vec_Wec_t *vEsop_local;
  
  memset(&g_CoverInfo,0,0x50);
  g_CoverInfo.Verbosity = Verbosity;
  g_CoverInfo.Quality = Quality;
  if (Verbosity != 0) {
    printf("\nEXORCISM, Ver.4.7: Exclusive Sum-of-Product Minimizer\n");
    printf("by Alan Mishchenko, Portland State University, July-September 2000\n\n");
    uVar1 = Vec_WecSize(vEsop);
    printf("Incoming ESOP has %d inputs, %d outputs, and %d cubes.\n",(ulong)(uint)nIns,
           (ulong)(uint)nOuts,(ulong)uVar1);
  }
  PrepareBitSetModule();
  iVar2 = Exorcism(vEsop,nIns,nOuts,pFileNameOut);
  if (iVar2 == 0) {
    printf("Something went wrong when minimizing the cover\n");
  }
  vEsop_local._4_4_ = (uint)(iVar2 != 0);
  return vEsop_local._4_4_;
}

Assistant:

int Abc_ExorcismMain( Vec_Wec_t * vEsop, int nIns, int nOuts, char * pFileNameOut, int Quality, int Verbosity )
{
    memset( &g_CoverInfo, 0, sizeof(cinfo) );
    g_CoverInfo.Quality = Quality;
    g_CoverInfo.Verbosity = Verbosity;
    if ( g_CoverInfo.Verbosity )
    {
        printf( "\nEXORCISM, Ver.4.7: Exclusive Sum-of-Product Minimizer\n" );
        printf( "by Alan Mishchenko, Portland State University, July-September 2000\n\n" );
        printf( "Incoming ESOP has %d inputs, %d outputs, and %d cubes.\n", nIns, nOuts, Vec_WecSize(vEsop) );
    }
    PrepareBitSetModule();
    if ( Exorcism( vEsop, nIns, nOuts, pFileNameOut ) == 0 )
    {
        printf( "Something went wrong when minimizing the cover\n" );
        return 0;
    }
    return 1;
}